

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::updateConfig
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Parameters *parameters)

{
  Client *client;
  uint *local_a8;
  undefined8 local_a0;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  uint *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  string local_68;
  Url local_48;
  
  if (this->version_ == v2) {
    client = this->client_;
    Vault::operator+(&local_68,"/v1/",&this->mount_);
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/config","");
    if (local_a8 == &local_98) {
      uStack_70 = uStack_90;
      uStack_6c = uStack_8c;
      local_88 = (uint *)&local_78;
    }
    else {
      local_88 = local_a8;
    }
    local_78 = CONCAT44(uStack_94,local_98);
    local_80 = local_a0;
    local_a0 = 0;
    local_98 = local_98 & 0xffffff00;
    local_a8 = &local_98;
    (*client->_vptr_Client[3])(&local_48,client,&local_68);
    HttpConsumer::post(__return_storage_ptr__,client,&local_48,parameters);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.value_._M_dataplus._M_p != &local_48.value_.field_2) {
      operator_delete(local_48.value_._M_dataplus._M_p,
                      local_48.value_.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != (uint *)&local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT44(uStack_94,local_98) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::updateConfig(const Parameters &parameters) {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::post(
      client_, client_.getUrl("/v1/" + mount_, Vault::Path{"/config"}),
      parameters);
}